

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::generateResendRequest(Session *this,BeginString *beginString,MsgSeqNum *msgSeqNum)

{
  bool bVar1;
  SEQNUM SVar2;
  uint64_t uVar3;
  Header *header;
  IntTConvertor<unsigned_long> *pIVar4;
  uint64_t uVar5;
  unsigned_long value;
  unsigned_long value_00;
  string local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  EndSeqNo local_368;
  EndSeqNo local_310;
  undefined1 local_2b8 [8];
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  allocator<char> local_1f1;
  STRING local_1f0;
  MsgType local_1d0;
  undefined1 local_178 [8];
  Message resendRequest;
  MsgSeqNum *msgSeqNum_local;
  BeginString *beginString_local;
  Session *this_local;
  
  resendRequest._336_8_ = msgSeqNum;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"2",&local_1f1);
  MsgType::MsgType(&local_1d0,&local_1f0);
  newMessage((Message *)local_178,this,&local_1d0);
  MsgType::~MsgType(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  SVar2 = getExpectedTargetNum(this);
  BeginSeqNo::BeginSeqNo
            ((BeginSeqNo *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics,(long)(int)SVar2);
  uVar3 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)resendRequest._336_8_);
  EndSeqNo::EndSeqNo((EndSeqNo *)local_2b8,uVar3 - 1);
  bVar1 = operator>=(&beginString->super_StringField,"FIX.4.2");
  if (bVar1) {
    EndSeqNo::EndSeqNo(&local_310,0);
    EndSeqNo::operator=((EndSeqNo *)local_2b8,&local_310);
    EndSeqNo::~EndSeqNo(&local_310);
  }
  else {
    bVar1 = operator<=(&beginString->super_StringField,"FIX.4.1");
    if (bVar1) {
      EndSeqNo::EndSeqNo(&local_368,999999);
      EndSeqNo::operator=((EndSeqNo *)local_2b8,&local_368);
      EndSeqNo::~EndSeqNo(&local_368);
    }
  }
  FieldMap::setField((FieldMap *)local_178,
                     (FieldBase *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics,true);
  FieldMap::setField((FieldMap *)local_178,(FieldBase *)local_2b8,true);
  header = Message::getHeader((Message *)local_178);
  fill(this,header);
  sendRaw(this,(Message *)local_178,0);
  pIVar4 = (IntTConvertor<unsigned_long> *)
           UInt64Field::operator_cast_to_unsigned_long
                     ((UInt64Field *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_3e8,pIVar4,value);
  std::operator+(&local_3c8,"Sent ResendRequest FROM: ",&local_3e8);
  std::operator+(&local_3a8,&local_3c8," TO: ");
  pIVar4 = (IntTConvertor<unsigned_long> *)
           UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_2b8);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_408,pIVar4,value_00);
  std::operator+(&local_388,&local_3a8,&local_408);
  SessionState::onEvent(&this->m_state,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  uVar3 = UInt64Field::operator_cast_to_unsigned_long
                    ((UInt64Field *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics);
  uVar5 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)resendRequest._336_8_);
  SessionState::resendRange(&this->m_state,uVar3,uVar5 - 1);
  EndSeqNo::~EndSeqNo((EndSeqNo *)local_2b8);
  BeginSeqNo::~BeginSeqNo((BeginSeqNo *)&endSeqNo.super_SeqNumField.super_FieldBase.m_metrics);
  Message::~Message((Message *)local_178);
  return;
}

Assistant:

void Session::generateResendRequest(const BeginString &beginString, const MsgSeqNum &msgSeqNum) {
  Message resendRequest = newMessage(MsgType(MsgType_ResendRequest));

  BeginSeqNo beginSeqNo((int)getExpectedTargetNum());
  EndSeqNo endSeqNo(msgSeqNum - 1);
  if (beginString >= FIX::BeginString_FIX42) {
    endSeqNo = 0;
  } else if (beginString <= FIX::BeginString_FIX41) {
    endSeqNo = 999999;
  }
  resendRequest.setField(beginSeqNo);
  resendRequest.setField(endSeqNo);
  fill(resendRequest.getHeader());
  sendRaw(resendRequest);

  m_state.onEvent(
      "Sent ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(beginSeqNo)
      + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

  m_state.resendRange(beginSeqNo, msgSeqNum - 1);
}